

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O0

void g_tree_foreach(GTree *tree,GTraverseFunc func,gpointer user_data)

{
  gboolean gVar1;
  GTreeNode *local_28;
  GTreeNode *node;
  gpointer user_data_local;
  GTraverseFunc func_local;
  GTree *tree_local;
  
  if (tree->root != (GTreeNode *)0x0) {
    local_28 = g_tree_first_node(tree);
    while ((local_28 != (GTreeNode *)0x0 &&
           (gVar1 = (*func)(local_28->key,local_28->value,user_data), gVar1 == 0))) {
      local_28 = g_tree_node_next(local_28);
    }
  }
  return;
}

Assistant:

void g_tree_foreach (GTree *tree, GTraverseFunc func, gpointer user_data)
{
    GTreeNode *node;

    g_return_if_fail (tree != NULL);

    if (!tree->root)
        return;

    node = g_tree_first_node (tree);

    while (node)
    {
        if ((*func) (node->key, node->value, user_data))
            break;

        node = g_tree_node_next (node);
    }
}